

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O0

bool __thiscall ON_RevSurface::Transform(ON_RevSurface *this,ON_Xform *xform)

{
  bool bVar1;
  int iVar2;
  double dVar3;
  byte local_181;
  ON_BoundingBox local_178;
  ON_3dVector local_148;
  ON_3dPoint local_130;
  double local_118;
  double d;
  ON_3dVector transXxY;
  ON_3dVector transY;
  ON_3dVector transX;
  double local_c0;
  double local_b8;
  undefined1 local_b0 [8];
  ON_3dVector transZ;
  ON_3dVector local_80;
  undefined1 local_68 [8];
  ON_3dVector Z;
  ON_3dVector Y;
  ON_3dVector X;
  bool rc;
  ON_Xform *xform_local;
  ON_RevSurface *this_local;
  
  (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x17])(this,1);
  ON_Object::TransformUserData((ON_Object *)this,xform);
  if (this->m_curve == (ON_Curve *)0x0) {
    local_181 = 0;
  }
  else {
    iVar2 = (*(this->m_curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x1c])
                      (this->m_curve,xform);
    local_181 = (byte)iVar2;
  }
  X.z._7_1_ = (bool)(local_181 & 1);
  ON_Line::Tangent(&local_80,&this->m_axis);
  local_68 = (undefined1  [8])local_80.x;
  Z.x = local_80.y;
  Z.y = local_80.z;
  ON_3dVector::PerpendicularTo((ON_3dVector *)&Y.z,(ON_3dVector *)local_68);
  ON_3dVector::Unitize((ON_3dVector *)&Y.z);
  ON_CrossProduct((ON_3dVector *)&transZ.z,(ON_3dVector *)local_68,(ON_3dVector *)&Y.z);
  Z.z = transZ.z;
  bVar1 = ON_Line::Transform(&this->m_axis,xform);
  if (!bVar1) {
    X.z._7_1_ = false;
  }
  ON_Line::Tangent((ON_3dVector *)local_b0,&this->m_axis);
  dVar3 = ON_3dVector::Length((ON_3dVector *)local_b0);
  if ((dVar3 != 0.0) || (NAN(dVar3))) {
    ON_Xform::operator*((ON_3dVector *)&transY.z,xform,(ON_3dVector *)&Y.z);
    ON_Xform::operator*((ON_3dVector *)&transXxY.z,xform,(ON_3dVector *)&Z.z);
    ON_CrossProduct((ON_3dVector *)&d,(ON_3dVector *)&transY.z,(ON_3dVector *)&transXxY.z);
    local_118 = ON_3dVector::operator*((ON_3dVector *)&d,(ON_3dVector *)local_b0);
    if (local_118 < 0.0) {
      ON_Line::Direction(&local_148,&this->m_axis);
      ON_3dPoint::operator-(&local_130,&(this->m_axis).from,&local_148);
      (this->m_axis).to.x = local_130.x;
      (this->m_axis).to.y = local_130.y;
      (this->m_axis).to.z = local_130.z;
    }
  }
  else {
    ON_3dPoint::operator+((ON_3dPoint *)&transX.z,&(this->m_axis).from,(ON_3dVector *)local_68);
    (this->m_axis).to.x = transX.z;
    (this->m_axis).to.y = local_c0;
    (this->m_axis).to.z = local_b8;
  }
  ON_BoundingBox::Destroy(&this->m_bbox);
  ON_Geometry::BoundingBox(&local_178,(ON_Geometry *)this);
  memcpy(&this->m_bbox,&local_178,0x30);
  return X.z._7_1_;
}

Assistant:

bool ON_RevSurface::Transform( const ON_Xform& xform )
{
  DestroyRuntimeCache();
  TransformUserData(xform);
  bool rc = (m_curve) ? m_curve->Transform(xform) : false;
  ON_3dVector X, Y, Z;
  Z = m_axis.Tangent();
  X.PerpendicularTo( Z );
  X.Unitize();
  Y = ON_CrossProduct( Z, X );
  if ( !m_axis.Transform(xform) )
    rc = false;
  ON_3dVector transZ = m_axis.Tangent();

  if ( transZ.Length() == 0.0 )
  {
    // transformation collapsed axis
    m_axis.to = m_axis.from + Z;
  }
  else
  {
    // see if axis needs to be reversed.
    // (Happens with transformations that
    // have negative determinant - like mirroring.)
    ON_3dVector transX = xform*X;
    ON_3dVector transY = xform*Y;
    ON_3dVector transXxY = ON_CrossProduct( transX, transY );
    double d = transXxY*transZ;
    if ( d < 0.0 )
      m_axis.to = m_axis.from - m_axis.Direction();
  }

  m_bbox.Destroy();
  m_bbox = BoundingBox();
  return rc;
}